

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O1

MPP_RET allocator_ion_free(void *ctx,MppBufferInfo *data)

{
  uint uVar1;
  MPP_RET MVar2;
  ion_handle_data data_1;
  
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"mpp_ion","do not accept NULL input\n","allocator_ion_free");
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    if (((byte)ion_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_ion","enter: ctx %p fd %d ptr %p size %d\n","allocator_ion_free",ctx,
                 (ulong)(uint)data->fd,data->ptr,data->size);
    }
    if (data->ptr != (void *)0x0) {
      munmap(data->ptr,data->size);
      data->ptr = (void *)0x0;
    }
    if (0 < data->fd) {
      close(data->fd);
      data->fd = -1;
    }
    if (data->hnd != (void *)0x0) {
      uVar1 = *(uint *)((long)ctx + 8);
      data_1.handle = (ion_user_handle_t)data->hnd;
      if (((byte)ion_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_ion","enter: fd %d\n","ion_free",(ulong)uVar1);
      }
      uVar1 = ion_ioctl(uVar1,-0x3ffbb6ff,&data_1);
      if (((byte)ion_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_ion","leave: ret %d\n","ion_free",(ulong)uVar1);
      }
      data->hnd = (void *)0x0;
    }
    MVar2 = MPP_OK;
    if (((byte)ion_debug & 1) != 0) {
      MVar2 = MPP_OK;
      _mpp_log_l(4,"mpp_ion","leave\n","allocator_ion_free");
    }
  }
  return MVar2;
}

Assistant:

static MPP_RET allocator_ion_free(void *ctx, MppBufferInfo *data)
{
    allocator_ctx_ion *p = NULL;
    if (NULL == ctx) {
        mpp_err_f("do not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    ion_dbg_func("enter: ctx %p fd %d ptr %p size %d\n",
                 ctx, data->fd, data->ptr, data->size);

    p = (allocator_ctx_ion *)ctx;
    if (data->ptr) {
        munmap(data->ptr, data->size);
        data->ptr = NULL;
    }

    if (data->fd > 0) {
        close(data->fd);
        data->fd = -1;
    }

    if (data->hnd) {
        ion_free(p->ion_device, (ion_user_handle_t)((intptr_t)data->hnd));
        data->hnd = NULL;
    }

    ion_dbg_func("leave\n");
    return MPP_OK;
}